

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_size(DSA *param_1)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t ret;
  size_t value_len;
  size_t integer_len;
  size_t order_len;
  DSA *dsa_local;
  
  if (param_1->version == 0) {
    dsa_local._4_4_ = 0;
  }
  else {
    uVar1 = BN_num_bytes((BIGNUM *)param_1->version);
    uVar5 = (ulong)uVar1;
    sVar2 = der_len_len(uVar5 + 1);
    uVar3 = sVar2 + 2 + uVar5;
    if (uVar3 < uVar5) {
      dsa_local._4_4_ = 0;
    }
    else {
      sVar2 = uVar3 * 2;
      if (sVar2 < uVar3) {
        dsa_local._4_4_ = 0;
      }
      else {
        sVar4 = der_len_len(sVar2);
        uVar5 = sVar4 + 1 + sVar2;
        if (uVar5 < sVar2) {
          dsa_local._4_4_ = 0;
        }
        else {
          dsa_local._4_4_ = (int)uVar5;
        }
      }
    }
  }
  return dsa_local._4_4_;
}

Assistant:

int DSA_size(const DSA *dsa) {
  if (dsa->q == NULL) {
    return 0;
  }

  size_t order_len = BN_num_bytes(dsa->q);
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // A DSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}